

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_EXT_fog_coord(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_EXT_fog_coord != 0) {
    glad_glFogCoordfEXT = (PFNGLFOGCOORDFEXTPROC)(*load)("glFogCoordfEXT");
    glad_glFogCoordfvEXT = (PFNGLFOGCOORDFVEXTPROC)(*load)("glFogCoordfvEXT");
    glad_glFogCoorddEXT = (PFNGLFOGCOORDDEXTPROC)(*load)("glFogCoorddEXT");
    glad_glFogCoorddvEXT = (PFNGLFOGCOORDDVEXTPROC)(*load)("glFogCoorddvEXT");
    glad_glFogCoordPointerEXT = (PFNGLFOGCOORDPOINTEREXTPROC)(*load)("glFogCoordPointerEXT");
  }
  return;
}

Assistant:

static void load_GL_EXT_fog_coord(GLADloadproc load) {
	if(!GLAD_GL_EXT_fog_coord) return;
	glad_glFogCoordfEXT = (PFNGLFOGCOORDFEXTPROC)load("glFogCoordfEXT");
	glad_glFogCoordfvEXT = (PFNGLFOGCOORDFVEXTPROC)load("glFogCoordfvEXT");
	glad_glFogCoorddEXT = (PFNGLFOGCOORDDEXTPROC)load("glFogCoorddEXT");
	glad_glFogCoorddvEXT = (PFNGLFOGCOORDDVEXTPROC)load("glFogCoorddvEXT");
	glad_glFogCoordPointerEXT = (PFNGLFOGCOORDPOINTEREXTPROC)load("glFogCoordPointerEXT");
}